

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

int conf_cmp_constkey(void *av,void *bv)

{
  uint uVar1;
  int iVar2;
  constkey *b;
  key *a;
  
  iVar2 = *av;
  uVar1 = 0xffffffff;
  if ((*bv <= iVar2) && (uVar1 = 1, iVar2 <= *bv)) {
    if (subkeytypes[iVar2] == 3) {
      iVar2 = strcmp(*(char **)((long)av + 8),*(char **)((long)bv + 8));
      return iVar2;
    }
    uVar1 = 0;
    if (subkeytypes[iVar2] == 2) {
      uVar1 = 0xffffffff;
      if (*(int *)((long)bv + 8) <= *(int *)((long)av + 8)) {
        uVar1 = (uint)(*(int *)((long)bv + 8) < *(int *)((long)av + 8));
      }
    }
  }
  return uVar1;
}

Assistant:

static int conf_cmp_constkey(void *av, void *bv)
{
    struct key *a = (struct key *)av;
    struct constkey *b = (struct constkey *)bv;

    if (a->primary < b->primary)
        return -1;
    else if (a->primary > b->primary)
        return +1;
    switch (subkeytypes[a->primary]) {
      case TYPE_INT:
        if (a->secondary.i < b->secondary.i)
            return -1;
        else if (a->secondary.i > b->secondary.i)
            return +1;
        return 0;
      case TYPE_STR:
        return strcmp(a->secondary.s, b->secondary.s);
      default:
        return 0;
    }
}